

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

void amqp_release_buffers(amqp_connection_state_t state)

{
  long in_RDI;
  amqp_pool_table_entry_t *entry;
  amqp_connection_state_enum _wanted_state;
  amqp_connection_state_t _check_state;
  int i;
  undefined8 *local_28;
  long lVar1;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  if (*(int *)(in_RDI + 0x80) != 0) {
    amqp_abort("Programming error: invalid AMQP connection state: expected %d, got %d",0,
               (ulong)*(uint *)(in_RDI + 0x80));
  }
  lVar1 = in_RDI;
  for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 1) {
    for (local_28 = *(undefined8 **)(in_RDI + (long)iVar2 * 8); local_28 != (undefined8 *)0x0;
        local_28 = (undefined8 *)*local_28) {
      amqp_maybe_release_buffers_on_channel
                ((amqp_connection_state_t)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                 (amqp_channel_t)((ulong)lVar1 >> 0x30));
    }
  }
  return;
}

Assistant:

void amqp_release_buffers(amqp_connection_state_t state) {
  int i;
  ENFORCE_STATE(state, CONNECTION_STATE_IDLE);

  for (i = 0; i < POOL_TABLE_SIZE; ++i) {
    amqp_pool_table_entry_t *entry = state->pool_table[i];

    for (; NULL != entry; entry = entry->next) {
      amqp_maybe_release_buffers_on_channel(state, entry->channel);
    }
  }
}